

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDVertex * __thiscall ON_SubD::VertexFromId(ON_SubD *this,uint vertex_id)

{
  element_type *peVar1;
  ON_SubDVertex *pOVar2;
  
  if ((1 < vertex_id + 1) &&
     (peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    pOVar2 = ON_SubDHeap::VertexFromId(&peVar1->m_heap,vertex_id);
    return pOVar2;
  }
  return (ON_SubDVertex *)0x0;
}

Assistant:

const class ON_SubDVertex* ON_SubD::VertexFromId(
  unsigned int vertex_id
  ) const
{
  for (;;)
  {
    if (0 == vertex_id || ON_UNSET_UINT_INDEX == vertex_id )
      break;
    const ON_SubDimple* subdimple = SubDimple();
    if (nullptr == subdimple)
      break;
    return subdimple->VertexFromId(vertex_id);
  }
  return nullptr;
}